

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void __thiscall
CharConvUCS2B::pad(CharConvUCS2B *this,CVmDataSource *dst,char ch,long str_bytes,CVmPackType *t)

{
  CharConv *in_RCX;
  CVmPackType *in_R8;
  long in_stack_000000e0;
  char in_stack_000000ee;
  char in_stack_000000ef;
  CVmDataSource *in_stack_000000f0;
  
  CharConv::get_byte_count(in_RCX,in_R8);
  CVmPack::write_padding(in_stack_000000f0,in_stack_000000ef,in_stack_000000ee,in_stack_000000e0);
  return;
}

Assistant:

virtual void pad(CVmDataSource *dst, char ch, long str_bytes,
                     const CVmPackType *t)
        { CVmPack::write_padding(dst, 0, ch, get_byte_count(t) - str_bytes); }